

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O2

void __thiscall lsim::ModelCircuit::sync_sub_circuit_components(ModelCircuit *this)

{
  ModelComponent *this_00;
  pointer puVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  component_ids_of_type((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,this,0x301)
  ;
  for (puVar1 = local_30._M_impl.super__Vector_impl_data._M_start;
      puVar1 != local_30._M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    this_00 = component_by_id(this,*puVar1);
    ModelComponent::sync_nested_circuit(this_00,this->m_context);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void ModelCircuit::sync_sub_circuit_components() {
    for (auto id : component_ids_of_type(COMPONENT_SUB_CIRCUIT)) {
        auto comp = component_by_id(id);
        comp->sync_nested_circuit(m_context);
    }
}